

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined1 uVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  byte *pbVar8;
  char cVar9;
  bool bVar10;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    bVar6 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar6 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      }
      else {
LAB_00160333:
        bVar6 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar6 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto LAB_00160333;
    bVar6 = 0;
  }
  iVar5 = 0;
  iVar4 = 0;
  pbVar3 = (byte *)ptr;
  if (bVar6 < 0x13) {
    if (bVar6 == 5) {
      iVar5 = iVar4;
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
    }
    else if (bVar6 == 6) {
      iVar5 = iVar4;
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
    }
    else {
      iVar5 = iVar4;
      if ((bVar6 == 7) && ((long)end - (long)ptr < 4)) {
        return -2;
      }
    }
  }
  else if (bVar6 < 0x18) {
    if (bVar6 == 0x13) {
      pbVar3 = (byte *)(ptr + 2);
      if (pbVar3 == (byte *)end) {
        return -1;
      }
      if (*pbVar3 == 0) {
        if ((ulong)(byte)ptr[3] == 0x78) {
          pbVar3 = (byte *)(ptr + 4);
          if (pbVar3 == (byte *)end) {
            return -1;
          }
          iVar5 = iVar4;
          if ((*pbVar3 == 0) &&
             ((*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[5]) & 0xfe) == 0x18)) {
            pbVar3 = (byte *)(ptr + 6);
            do {
              if (pbVar3 == (byte *)end) {
                return -1;
              }
              bVar1 = *pbVar3;
              if (bVar1 < 0xdc) {
                bVar6 = 7;
                if (3 < bVar1 - 0xd8) {
                  if (bVar1 == 0) {
                    bVar6 = *(byte *)((long)enc[1].scanners + (ulong)pbVar3[1]);
                  }
                  else {
LAB_001605ad:
                    bVar6 = 0x1d;
                  }
                }
              }
              else if (bVar1 - 0xdc < 4) {
                bVar6 = 8;
              }
              else {
                if ((bVar1 != 0xff) || (pbVar3[1] < 0xfe)) goto LAB_001605ad;
                bVar6 = 0;
              }
              if (1 < bVar6 - 0x18) {
                if (bVar6 == 0x12) {
                  pbVar3 = pbVar3 + 2;
                  iVar5 = 10;
                }
                break;
              }
              pbVar3 = pbVar3 + 2;
            } while( true );
          }
        }
        else {
          iVar5 = iVar4;
          if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\x19') {
            do {
              pbVar8 = pbVar3;
              pbVar3 = pbVar8 + 2;
              if (pbVar3 == (byte *)end) {
                return -1;
              }
              bVar1 = *pbVar3;
              if (bVar1 < 0xdc) {
                cVar9 = '\a';
                if (3 < bVar1 - 0xd8) {
                  if (bVar1 == 0) {
                    cVar9 = *(char *)((long)enc[1].scanners + (ulong)pbVar8[3]);
                  }
                  else {
LAB_00160676:
                    cVar9 = '\x1d';
                  }
                }
              }
              else if (bVar1 - 0xdc < 4) {
                cVar9 = '\b';
              }
              else {
                if ((bVar1 != 0xff) || (pbVar8[3] < 0xfe)) goto LAB_00160676;
                cVar9 = '\0';
              }
            } while (cVar9 == '\x19');
            if (cVar9 == '\x12') {
              iVar5 = 10;
              pbVar3 = pbVar8 + 4;
            }
          }
        }
      }
    }
    else if (bVar6 == 0x16) goto LAB_001603df;
  }
  else if ((bVar6 == 0x18) ||
          ((iVar5 = iVar4, bVar6 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[1] >> 3 & 0x1c |
                             (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >> ((byte)ptr[1] & 0x1f)
            & 1) != 0)))) {
LAB_001603df:
    if (ptr + 2 == end) {
      return -1;
    }
    lVar7 = (long)end - (long)ptr;
    pbVar3 = (byte *)(ptr + 4);
LAB_0016040f:
    lVar7 = lVar7 + -2;
    bVar1 = pbVar3[-2];
    if (bVar1 < 0xdc) {
      uVar2 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar2 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar3[-1]);
        }
        else {
LAB_00160465:
          uVar2 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar2 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (pbVar3[-1] < 0xfe)) goto LAB_00160465;
      uVar2 = 0;
    }
    switch(uVar2) {
    case 5:
      if (lVar7 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar7 < 3) {
        return -2;
      }
      break;
    case 7:
      if (lVar7 < 4) {
        return -2;
      }
      break;
    case 0x12:
      iVar5 = 9;
      goto LAB_001605f9;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_00160481_caseD_16;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(pbVar3[-1] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >> (pbVar3[-1] & 0x1f)
          & 1) != 0) goto switchD_00160481_caseD_16;
    }
    pbVar3 = pbVar3 + -2;
    iVar5 = iVar4;
  }
LAB_001605f9:
  *nextTokPtr = (char *)pbVar3;
  return iVar5;
switchD_00160481_caseD_16:
  bVar10 = pbVar3 == (byte *)end;
  pbVar3 = pbVar3 + 2;
  if (bVar10) {
    return -1;
  }
  goto LAB_0016040f;
}

Assistant:

static
int PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}